

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O1

void __thiscall CM_HeadLossModel::setResistance(CM_HeadLossModel *this,Pipe *pipe)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (pipe->super_Link).diameter;
  dVar2 = (pipe->roughness * 4.0) / (dVar1 * 4.68097305446 * dVar1);
  dVar1 = pow(dVar1 * 0.25,-1.333);
  dVar2 = dVar1 * dVar2 * dVar2 * pipe->length;
  dVar1 = 100000000.0;
  if (dVar2 <= 100000000.0) {
    dVar1 = dVar2;
  }
  pipe->resistance = dVar1;
  return;
}

Assistant:

void CM_HeadLossModel::setResistance(Pipe* pipe)
{
    double d = pipe->diameter;
    double r = 4.0 * pipe->roughness / (1.49 * PI * d * d);
    pipe->resistance = r * r * pow(d/4.0, -1.333) * pipe->length;
    pipe->resistance = min(pipe->resistance, HIGH_RESISTANCE);
}